

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmainwindowlayout_p.cpp
# Opt level: O2

void QDockWidgetGroupWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_id == 0 && _c == InvokeMetaMethod) {
    resized((QDockWidgetGroupWindow *)_o);
  }
  if (_c == IndexOfMethod) {
    QtMocHelpers::indexOfMethod<void(QDockWidgetGroupWindow::*)()>
              ((QtMocHelpers *)_a,(void **)resized,0,0);
    return;
  }
  return;
}

Assistant:

void QDockWidgetGroupWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDockWidgetGroupWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->resized(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDockWidgetGroupWindow::*)()>(_a, &QDockWidgetGroupWindow::resized, 0))
            return;
    }
}